

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_decimal_fraction
          (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
          string_type *result,error_code *ec)

{
  stream_source<unsigned_char> *this_00;
  pointer puVar1;
  uint8_t *puVar2;
  cbor_errc cVar3;
  byte bVar4;
  char_result<unsigned_char> cVar5;
  size_t sVar6;
  uint64_t uVar7;
  uint64_t value;
  int64_t value_00;
  ssize_t sVar8;
  size_t in_RCX;
  size_type length;
  _Alloc_hider buffer;
  uint8_t b;
  string_type str;
  bigint n;
  basic_bigint<std::allocator<unsigned_char>_> local_80;
  basic_bigint<std::allocator<unsigned_char>_> local_58;
  
  sVar6 = get_size(this,ec);
  if (ec->_M_value != 0) {
    return;
  }
  if (sVar6 != 2) {
LAB_001ff495:
    cVar3 = invalid_decimal_fraction;
LAB_001ff497:
    std::error_code::operator=(ec,cVar3);
    this->more_ = false;
    return;
  }
  this_00 = &this->source_;
  cVar5 = stream_source<unsigned_char>::peek(this_00);
  if (((ushort)cVar5 >> 8 & 1) != 0) {
    cVar3 = unexpected_eof;
    goto LAB_001ff497;
  }
  bVar4 = cVar5.value >> 5;
  if (bVar4 == 1) {
    uVar7 = get_int64_value(this,ec);
  }
  else {
    if (bVar4 != 0) goto LAB_001ff495;
    uVar7 = get_uint64_value(this,ec);
  }
  if (ec->_M_value != 0) {
    return;
  }
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  cVar5 = stream_source<unsigned_char>::peek(this_00);
  if (((ushort)cVar5 >> 8 & 1) == 0) {
    bVar4 = cVar5.value >> 5;
    if (bVar4 != 6) {
      if (bVar4 == 1) {
        value_00 = get_int64_value(this,ec);
        if (ec->_M_value != 0) goto LAB_001ff6fb;
        jsoncons::detail::from_integer<long,std::__cxx11::string>(value_00,&str);
LAB_001ff68d:
        if ((uVar7 + 0x7fffffff >> 1 < 0x7fffffff && str._M_string_length < 0x7fffffff) &&
           (str._M_string_length != 0)) {
          length = str._M_string_length;
          buffer._M_p = str._M_dataplus._M_p;
          if (*str._M_dataplus._M_p == '-') {
            std::__cxx11::string::push_back((char)result);
            buffer._M_p = str._M_dataplus._M_p + 1;
            length = str._M_string_length - 1;
          }
          jsoncons::detail::prettify_string<std::__cxx11::string>
                    (buffer._M_p,length,(int)uVar7,-4,0x11,result);
          goto LAB_001ff6fb;
        }
      }
      else if (bVar4 == 0) {
        value = get_uint64_value(this,ec);
        if (ec->_M_value != 0) goto LAB_001ff6fb;
        jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>(value,&str);
        goto LAB_001ff68d;
      }
      cVar3 = invalid_decimal_fraction;
      goto LAB_001ff6ee;
    }
    sVar8 = stream_source<unsigned_char>::read(this_00,(int)&str + -1,(void *)0x1,in_RCX);
    if ((sVar8 == 0) ||
       (cVar5 = stream_source<unsigned_char>::peek(this_00), ((ushort)cVar5 >> 8 & 1) != 0))
    goto LAB_001ff5fe;
    if (((ushort)cVar5 & 0xe0) != 0x40) goto LAB_001ff68d;
    puVar1 = (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar1) {
      (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar1;
    }
    read_byte_string(this,&this->bytes_buffer_,ec);
    if (ec->_M_value == 0) {
      if ((b & 0x1f) == 3) {
        puVar2 = (this->bytes_buffer_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                  (&n,1,puVar2,
                   (long)(this->bytes_buffer_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar2);
        local_58.field_0._0_1_ = 2;
        local_58.field_0.common_stor_.length_ = 1;
        local_58.field_0.short_stor_.values_[0] = 1;
        local_58.field_0.short_stor_.values_[1] = 0;
        operator-(&local_80,&local_58,&n);
        basic_bigint<std::allocator<unsigned_char>_>::operator=(&n,&local_80);
        basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_80);
        basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_58);
        basic_bigint<std::allocator<unsigned_char>>::
        write_string<char,std::char_traits<char>,std::allocator<char>>
                  ((basic_bigint<std::allocator<unsigned_char>> *)&n,&str);
      }
      else {
        if ((b & 0x1f) != 2) goto LAB_001ff68d;
        puVar2 = (this->bytes_buffer_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                  (&n,1,puVar2,
                   (long)(this->bytes_buffer_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar2);
        basic_bigint<std::allocator<unsigned_char>>::
        write_string<char,std::char_traits<char>,std::allocator<char>>
                  ((basic_bigint<std::allocator<unsigned_char>> *)&n,&str);
      }
      basic_bigint<std::allocator<unsigned_char>_>::destroy(&n);
      goto LAB_001ff68d;
    }
  }
  else {
LAB_001ff5fe:
    cVar3 = unexpected_eof;
LAB_001ff6ee:
    std::error_code::operator=(ec,cVar3);
  }
  this->more_ = false;
LAB_001ff6fb:
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

void read_decimal_fraction(string_type& result, std::error_code& ec)
    {
        std::size_t size = get_size(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        if (size != 2)
        {
            ec = cbor_errc::invalid_decimal_fraction;
            more_ = false;
            return;
        }

        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        int64_t exponent = 0;
        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                exponent = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                exponent = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_decimal_fraction;
                more_ = false;
                return;
            }
        }

        string_type str(alloc_);

        c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }

        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                uint64_t val = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                jsoncons::detail::from_integer(val, str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                int64_t val = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                jsoncons::detail::from_integer(val, str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::semantic_tag:
            {
                uint8_t b;
                if (source_.read(&b, 1) == 0)
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                uint8_t tag = get_additional_information_value(b);
                c = source_.peek();
                if (JSONCONS_UNLIKELY(c.eof))
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                if (get_major_type(c.value) == jsoncons::cbor::detail::cbor_major_type::byte_string)
                {
                    bytes_buffer_.clear();
                    read_byte_string(bytes_buffer_, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    if (tag == 2)
                    {
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n.write_string(str);
                    }
                    else if (tag == 3)
                    {
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n = -1 - n;
                        n.write_string(str);
                    }
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_decimal_fraction;
                more_ = false;
                return;
            }
        }

        if (str.size() >= static_cast<std::size_t>((std::numeric_limits<int32_t>::max)()) || 
            exponent >= (std::numeric_limits<int32_t>::max)() || 
            exponent <= (std::numeric_limits<int32_t>::min)())
        {
            ec = cbor_errc::invalid_decimal_fraction;
            more_ = false;
            return;
        }
        else if (str.size() > 0)
        {
            if (str[0] == '-')
            {
                result.push_back('-');
                jsoncons::detail::prettify_string(str.c_str()+1, str.size()-1, (int)exponent, -4, 17, result);
            }
            else
            {
                jsoncons::detail::prettify_string(str.c_str(), str.size(), (int)exponent, -4, 17, result);
            }
        }
        else
        {
            ec = cbor_errc::invalid_decimal_fraction;
            more_ = false;
            return;
        }
    }